

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O2

void __thiscall indk::Neuron::Entry::doPrepare(Entry *this)

{
  pointer ppSVar1;
  pointer ppSVar2;
  
  this->t = 0;
  this->tm = -1;
  ppSVar1 = (this->Synapses).
            super__Vector_base<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar2 = (this->Synapses).
                 super__Vector_base<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar2 != ppSVar1;
      ppSVar2 = ppSVar2 + 1) {
    Synapse::doReset(*ppSVar2);
  }
  return;
}

Assistant:

void indk::Neuron::Entry::doPrepare() {
    t = 0;
    tm = -1;
    for (auto S: Synapses) S -> doReset();
    //for (auto S: Synapses) S -> doPrepare();
}